

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_brcond_i64_mips64
               (TCGContext_conflict5 *tcg_ctx,TCGCond cond,TCGv_i64 arg1,TCGv_i64 arg2,TCGLabel *l)

{
  TCGOp *pTVar1;
  uintptr_t o_1;
  uintptr_t o;
  
  if (cond != TCG_COND_NEVER) {
    if (cond == TCG_COND_ALWAYS) {
      *(short *)&l->field_0x2 = (short)((uint)*(ushort *)&l->field_0x2 * 0x10000 + 0x10000 >> 0x10);
      pTVar1 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_br);
      pTVar1->args[0] = (TCGArg)l;
    }
    else {
      *(short *)&l->field_0x2 = (short)((uint)*(ushort *)&l->field_0x2 * 0x10000 + 0x10000 >> 0x10);
      pTVar1 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_brcond_i64);
      pTVar1->args[0] = (TCGArg)(arg1 + (long)tcg_ctx);
      pTVar1->args[1] = (TCGArg)(arg2 + (long)tcg_ctx);
      pTVar1->args[2] = (ulong)cond;
      pTVar1->args[3] = (TCGArg)l;
    }
  }
  return;
}

Assistant:

void tcg_gen_brcond_i64(TCGContext *tcg_ctx, TCGCond cond, TCGv_i64 arg1, TCGv_i64 arg2, TCGLabel *l)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_br(tcg_ctx, l);
    } else if (cond != TCG_COND_NEVER) {
        l->refs++;
#if TCG_TARGET_REG_BITS == 32
            tcg_gen_op6ii_i32(tcg_ctx, INDEX_op_brcond2_i32, TCGV_LOW(tcg_ctx, arg1),
                              TCGV_HIGH(tcg_ctx, arg1), TCGV_LOW(tcg_ctx, arg2),
                              TCGV_HIGH(tcg_ctx, arg2), cond, label_arg(l));
#else
            tcg_gen_op4ii_i64(tcg_ctx, INDEX_op_brcond_i64, arg1, arg2, cond,
                              label_arg(l));
#endif
    }
}